

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::GetTailCallFieldHandlerName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,ParseCardinality card,TypeFormat type_format,
          int tag_length_bytes,Options *options)

{
  Options *options_00;
  Options *options_01;
  Options *options_02;
  Options *options_03;
  Options *options_04;
  undefined4 in_register_00000084;
  AlphaNum local_3b0;
  string local_380;
  AlphaNum local_360;
  AlphaNum local_330;
  AlphaNum local_300;
  string local_2d0;
  AlphaNum local_2b0;
  AlphaNum local_280;
  AlphaNum local_250;
  string local_220;
  AlphaNum local_200;
  AlphaNum local_1d0;
  AlphaNum local_1a0;
  string local_170;
  AlphaNum local_150;
  AlphaNum local_120;
  AlphaNum local_f0;
  string local_c0;
  AlphaNum local_a0;
  AlphaNum local_70;
  undefined1 local_29;
  _anonymous_namespace_ *local_28;
  Options *options_local;
  ParseCardinality local_18;
  int tag_length_bytes_local;
  TypeFormat type_format_local;
  ParseCardinality card_local;
  string *name;
  
  tag_length_bytes_local = (int)this;
  local_28 = (_anonymous_namespace_ *)CONCAT44(in_register_00000084,tag_length_bytes);
  local_29 = 0;
  options_local._4_4_ = type_format;
  local_18 = card;
  _type_format_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch(tag_length_bytes_local) {
  case 0:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 1:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 2:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 3:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (local_18 < kRepeated) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else if (local_18 - kRepeated < 5) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else if (local_18 - 7 < 3) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  switch(local_18) {
  case kSingular:
  case kRepeated:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case kOneof:
  case kPacked:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 4:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 5:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case 6:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  anon_unknown_6::CodedTagType(options_local._4_4_);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  switch(local_18) {
  case kRepeated:
  case kPacked:
  case 6:
    strings::AlphaNum::AlphaNum(&local_70,", ");
    (anonymous_namespace)::TcParserName_abi_cxx11_(&local_c0,local_28,options_00);
    strings::AlphaNum::AlphaNum(&local_a0,&local_c0);
    strings::AlphaNum::AlphaNum(&local_f0,"kNoConversion");
    StrAppend(__return_storage_ptr__,&local_70,&local_a0,&local_f0);
    std::__cxx11::string::~string((string *)&local_c0);
    break;
  case 4:
  case 5:
    strings::AlphaNum::AlphaNum(&local_120,", ");
    (anonymous_namespace)::TcParserName_abi_cxx11_(&local_170,local_28,options_01);
    strings::AlphaNum::AlphaNum(&local_150,&local_170);
    strings::AlphaNum::AlphaNum(&local_1a0,"kZigZag");
    StrAppend(__return_storage_ptr__,&local_120,&local_150,&local_1a0);
    std::__cxx11::string::~string((string *)&local_170);
    break;
  case 7:
    strings::AlphaNum::AlphaNum(&local_1d0,", ");
    (anonymous_namespace)::TcParserName_abi_cxx11_(&local_220,local_28,options_02);
    strings::AlphaNum::AlphaNum(&local_200,&local_220);
    strings::AlphaNum::AlphaNum(&local_250,"kNoUtf8");
    StrAppend(__return_storage_ptr__,&local_1d0,&local_200,&local_250);
    std::__cxx11::string::~string((string *)&local_220);
    break;
  case 8:
    strings::AlphaNum::AlphaNum(&local_280,", ");
    (anonymous_namespace)::TcParserName_abi_cxx11_(&local_2d0,local_28,options_03);
    strings::AlphaNum::AlphaNum(&local_2b0,&local_2d0);
    strings::AlphaNum::AlphaNum(&local_300,"kUtf8");
    StrAppend(__return_storage_ptr__,&local_280,&local_2b0,&local_300);
    std::__cxx11::string::~string((string *)&local_2d0);
    break;
  case 9:
    strings::AlphaNum::AlphaNum(&local_330,", ");
    (anonymous_namespace)::TcParserName_abi_cxx11_(&local_380,local_28,options_04);
    strings::AlphaNum::AlphaNum(&local_360,&local_380);
    strings::AlphaNum::AlphaNum(&local_3b0,"kUtf8ValidateOnly");
    StrAppend(__return_storage_ptr__,&local_330,&local_360,&local_3b0);
    std::__cxx11::string::~string((string *)&local_380);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GetTailCallFieldHandlerName(ParseCardinality card,
                                        TypeFormat type_format,
                                        int tag_length_bytes,
                                        const Options& options) {
  std::string name;

  // The field implementation functions are prefixed by cardinality:
  //   `Singular` for optional or implicit fields.
  //   `Repeated` for non-packed repeated.
  //   `Packed` for packed repeated.
  switch (card) {
    case ParseCardinality::kSingular:
      name.append("Singular");
      break;
    case ParseCardinality::kOneof:
      name.append("Oneof");
      break;
    case ParseCardinality::kRepeated:
      name.append("Repeated");
      break;
    case ParseCardinality::kPacked:
      name.append("Packed");
      break;
  }

  // Next in the function name is the TypeFormat-specific name.
  switch (type_format) {
    case TypeFormat::kFixed64:
    case TypeFormat::kFixed32:
      name.append("Fixed");
      break;

    case TypeFormat::kVar64:
    case TypeFormat::kVar32:
    case TypeFormat::kSInt64:
    case TypeFormat::kSInt32:
    case TypeFormat::kBool:
      name.append("Varint");
      break;

    case TypeFormat::kBytes:
    case TypeFormat::kString:
    case TypeFormat::kStringValidateOnly:
      name.append("String");
      break;

    default:
      break;
  }

  name.append("<");

  // Determine the numeric layout type for the parser to use, independent of
  // the specific parsing logic used.
  switch (type_format) {
    case TypeFormat::kVar64:
    case TypeFormat::kFixed64:
      name.append("uint64_t, ");
      break;

    case TypeFormat::kSInt64:
      name.append("int64_t, ");
      break;

    case TypeFormat::kVar32:
    case TypeFormat::kFixed32:
      name.append("uint32_t, ");
      break;

    case TypeFormat::kSInt32:
      name.append("int32_t, ");
      break;

    case TypeFormat::kBool:
      name.append("bool, ");
      break;

    default:
      break;
  }

  name.append(CodedTagType(tag_length_bytes));

  switch (type_format) {
    case TypeFormat::kVar64:
    case TypeFormat::kVar32:
    case TypeFormat::kBool:
      StrAppend(&name, ", ", TcParserName(options), "kNoConversion");
      break;

    case TypeFormat::kSInt64:
    case TypeFormat::kSInt32:
      StrAppend(&name, ", ", TcParserName(options), "kZigZag");
      break;

    case TypeFormat::kBytes:
      StrAppend(&name, ", ", TcParserName(options), "kNoUtf8");
      break;

    case TypeFormat::kString:
      StrAppend(&name, ", ", TcParserName(options), "kUtf8");
      break;

    case TypeFormat::kStringValidateOnly:
      StrAppend(&name, ", ", TcParserName(options), "kUtf8ValidateOnly");
      break;

    default:
      break;
  }

  name.append(">");
  return name;
}